

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int __thiscall QString::remove(QString *this,char *__filename)

{
  QVLAStorage<2UL,_2UL,_256LL> *array;
  char16_t *pcVar1;
  ulong aalloc;
  CaseSensitivity in_EDX;
  long lVar2;
  char16_t *__value;
  long in_FS_OFFSET;
  QStringView local_268;
  back_insert_iterator<QVarLengthArray<char16_t,_256LL>_> local_258;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __value = *(char16_t **)(__filename + 8);
  pcVar1 = (this->d).ptr;
  if ((__value < pcVar1) || (pcVar1 + (this->d).size <= __value)) {
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a = *(qsizetype *)(__filename + 0x10);
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s = (qsizetype)__value;
    removeStringImpl<QStringView>(this,(QStringView *)&local_250,in_EDX);
  }
  else {
    aalloc = *(ulong *)(__filename + 0x10);
    array = &local_250.super_QVLAStorage<2UL,_2UL,_256LL>;
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a = 0x100;
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s = 0;
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr = array;
    if (0x100 < aalloc) {
      QVLABase<char16_t>::reallocate_impl(&local_250.super_QVLABase<char16_t>,0x100,array,0,aalloc);
    }
    local_258.container = &local_250;
    if (aalloc != 0) {
      lVar2 = aalloc + 1;
      do {
        std::back_insert_iterator<QVarLengthArray<char16_t,_256LL>_>::operator=(&local_258,__value);
        __value = __value + 1;
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    local_268.m_size = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
    local_268.m_data =
         (storage_type_conflict *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
    removeStringImpl<QStringView>(this,&local_268,in_EDX);
    if ((QVLAStorage<2UL,_2UL,_256LL> *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr !=
        array) {
      QtPrivate::sizedFree
                (local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,
                 local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(const QString &str, Qt::CaseSensitivity cs)
{
    const auto s = str.d.data();
    if (QtPrivate::q_points_into_range(s, d))
        removeStringImpl(*this, QStringView{QVarLengthArray(s, s + str.size())}, cs);
    else
        removeStringImpl(*this, qToStringViewIgnoringNull(str), cs);
    return *this;
}